

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

int Kit_TruthVarInSupport(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint *puVar7;
  int iVar8;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  uVar5 = (ulong)uVar1;
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pTruth[uVar3] >> 1 ^ pTruth[uVar3]) & 0x55555555) != 0) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      break;
    case 1:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pTruth[uVar3] >> 2 ^ pTruth[uVar3]) & 0x33333333) != 0) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      break;
    case 2:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pTruth[uVar3] >> 4 ^ pTruth[uVar3]) & 0xf0f0f0f) != 0) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      break;
    case 3:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if (((pTruth[uVar3] >> 8 ^ pTruth[uVar3]) & 0xff00ff) != 0) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      break;
    case 4:
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          if ((pTruth[uVar3] & 0xffff) != pTruth[uVar3] >> 0x10) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      break;
    default:
      if (0 < (int)uVar1) {
        bVar4 = (byte)(iVar + -5);
        uVar2 = 1 << (bVar4 & 0x1f);
        iVar6 = 2 << (bVar4 & 0x1f);
        uVar5 = 1;
        if (1 < (int)uVar2) {
          uVar5 = (ulong)uVar2;
        }
        puVar7 = pTruth + (int)uVar2;
        iVar8 = 0;
        do {
          if (iVar + -5 != 0x1f) {
            uVar3 = 0;
            do {
              if (pTruth[uVar3] != puVar7[uVar3]) {
                return 1;
              }
              uVar3 = uVar3 + 1;
            } while (uVar5 != uVar3);
          }
          iVar8 = iVar8 + iVar6;
          puVar7 = puVar7 + iVar6;
          pTruth = pTruth + iVar6;
        } while (iVar8 < (int)uVar1);
        return 0;
      }
    }
    return 0;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                ,0x113,"int Kit_TruthVarInSupport(unsigned int *, int, int)");
}

Assistant:

int Kit_TruthVarInSupport( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x55555555) != ((pTruth[i] & 0xAAAAAAAA) >> 1) )
                return 1;
        return 0;
    case 1:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x33333333) != ((pTruth[i] & 0xCCCCCCCC) >> 2) )
                return 1;
        return 0;
    case 2:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x0F0F0F0F) != ((pTruth[i] & 0xF0F0F0F0) >> 4) )
                return 1;
        return 0;
    case 3:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x00FF00FF) != ((pTruth[i] & 0xFF00FF00) >> 8) )
                return 1;
        return 0;
    case 4:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x0000FFFF) != ((pTruth[i] & 0xFFFF0000) >> 16) )
                return 1;
        return 0;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( pTruth[i] != pTruth[Step+i] )
                    return 1;
            pTruth += 2*Step;
        }
        return 0;
    }
}